

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

BYTE * find_central_dir(FILE *fin)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  int *__ptr;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char cVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  EndOfCentralDirectory eod;
  uchar buf [1028];
  ulong local_460;
  undefined1 local_44e [12];
  uint local_442;
  uint local_43e;
  char acStack_439 [1033];
  
  local_460 = 0;
  fseek((FILE *)fin,0,2);
  lVar3 = ftell((FILE *)fin);
  lVar10 = 0xffff;
  if (lVar3 < 0xffff) {
    lVar10 = lVar3;
  }
  lVar11 = 4;
  do {
    if (lVar10 <= lVar11) goto LAB_00103d7e;
    lVar11 = lVar11 + 0x400;
    if (lVar10 <= lVar11) {
      lVar11 = lVar10;
    }
    uVar8 = (ulong)(uint)((int)lVar3 - (int)lVar11);
    uVar12 = lVar3 - uVar8;
    if (0x403 < (long)uVar12) {
      uVar12 = 0x404;
    }
    iVar2 = fseek((FILE *)fin,uVar8,0);
    cVar9 = '\x01';
    if (iVar2 == 0) {
      iVar2 = (int)uVar12;
      sVar4 = fread(acStack_439 + 1,1,uVar12 & 0xffffffff,(FILE *)fin);
      if (sVar4 == (uVar12 & 0xffffffff)) {
        if (3 < iVar2) {
          pcVar5 = acStack_439 + (ulong)(iVar2 - 3) + 3;
          uVar8 = (lVar3 + (iVar2 + -4)) - lVar11;
          lVar6 = (long)(iVar2 + -4) + 1;
          do {
            if ((((acStack_439[lVar6] == 'P') && (pcVar5[-2] == 'K')) && (pcVar5[-1] == '\x05')) &&
               (*pcVar5 == '\x06')) {
              local_460 = uVar8 & 0xffffffff;
              break;
            }
            pcVar5 = pcVar5 + -1;
            uVar8 = uVar8 - 1;
            lVar7 = lVar6 + -1;
            bVar1 = 0 < lVar6;
            lVar6 = lVar7;
          } while (lVar7 != 0 && bVar1);
        }
        cVar9 = (local_460 != 0) * '\x03';
      }
    }
  } while (cVar9 == '\0');
  if (cVar9 == '\x03') {
LAB_00103d7e:
    if (local_460 != 0) {
      iVar2 = fseek((FILE *)fin,local_460,0);
      if (iVar2 != 0) {
        return (BYTE *)0x0;
      }
      sVar4 = fread(local_44e,0x16,1,(FILE *)fin);
      if (sVar4 == 1) {
        iVar2 = fseek((FILE *)fin,(ulong)local_43e,0);
        if (iVar2 != 0) {
          return (BYTE *)0x0;
        }
        uVar8 = (ulong)local_442;
        __ptr = (int *)malloc((ulong)(local_442 + 4));
        if (__ptr == (int *)0x0) {
          no_mem = 1;
        }
        else {
          sVar4 = fread(__ptr,1,uVar8,(FILE *)fin);
          if ((sVar4 == uVar8) && (*__ptr == 0x2014b50)) {
            *(undefined4 *)((long)__ptr + uVar8) = 0x6054b50;
            return (BYTE *)__ptr;
          }
          free(__ptr);
        }
      }
    }
  }
  return (BYTE *)0x0;
}

Assistant:

BYTE *find_central_dir(FILE *fin)
{
	unsigned char buf[BUFREADCOMMENT + 4];
	EndOfCentralDirectory eod;
	BYTE *dir;
	long file_size;
	long back_read;
	long max_back;		// maximum size of global comment
	long pos_found = 0;

	fseek(fin, 0, SEEK_END);

	file_size = ftell(fin);
	max_back = 0xffff > file_size ? file_size : 0xffff;

	back_read = 4;
	while (back_read < max_back)
	{
		UINT32 read_size, read_pos;
		int i;
		if (back_read + BUFREADCOMMENT > max_back) 
			back_read = max_back;
		else
			back_read += BUFREADCOMMENT;
		read_pos = file_size - back_read;

		read_size = (BUFREADCOMMENT + 4) < (file_size - read_pos) ?
					(BUFREADCOMMENT + 4) : (file_size - read_pos);

		if (fseek(fin, read_pos, SEEK_SET) != 0)
			return NULL;

		if (fread(buf, 1, read_size, fin) != read_size)
			return NULL;

		for (i = (int)read_size - 3; (i--) > 0;)
		{
			if (buf[i] == 'P' && buf[i+1] == 'K' && buf[i+2] == 5 && buf[i+3] == 6)
			{
				pos_found = read_pos + i;
				break;
			}
		}

		if (pos_found != 0)
			break;
	}
	if (pos_found == 0 ||
		fseek(fin, pos_found, SEEK_SET) != 0 ||
		fread(&eod, sizeof(eod), 1, fin) != 1 ||
		fseek(fin, LittleLong(eod.DirectoryOffset), SEEK_SET) != 0)
	{
		return NULL;
	}
	dir = malloc(LittleLong(eod.DirectorySize) + 4);
	if (dir == NULL)
	{
		no_mem = 1;
		return NULL;
	}
	if (fread(dir, 1, LittleLong(eod.DirectorySize), fin) != LittleLong(eod.DirectorySize))
	{
		free(dir);
		return NULL;
	}
	if (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) != 0)
	{
		free(dir);
		return NULL;
	}
	memcpy(dir + LittleLong(eod.DirectorySize), (const BYTE *)&endofdir, sizeof(UINT32));
	return dir;
}